

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O3

int MPIABI_Cart_shift(MPIABI_Comm comm,int direction,int disp,int *rank_source,int *rank_dest)

{
  int iVar1;
  
  iVar1 = MPI_Cart_shift();
  return iVar1;
}

Assistant:

int MPIABI_Cart_shift(
  MPIABI_Comm comm,
  int direction,
  int disp,
  int * rank_source,
  int * rank_dest
) {
  return MPI_Cart_shift(
    (MPI_Comm)(WPI_Comm)comm,
    direction,
    disp,
    rank_source,
    rank_dest
  );
}